

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

void __thiscall cmCTestHG::LogParser::EndElement(LogParser *this,string *name)

{
  bool bVar1;
  reference pvVar2;
  reference pCVar3;
  long lVar4;
  Change *change_1;
  iterator __end9;
  iterator __begin9;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *__range9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_110;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_108;
  string local_100 [8];
  string added_paths_1;
  Change *change;
  iterator __end8;
  iterator __begin8;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *__range8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b0;
  string local_a8 [8];
  string added_paths;
  Change local_78;
  reference local_50;
  string *path;
  iterator __end7;
  iterator __begin7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string *name_local;
  LogParser *this_local;
  
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = name;
  bVar1 = std::operator==(name,"logentry");
  if (bVar1) {
    (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])
              (this->HG,&this->Rev,&this->Changes);
  }
  else {
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
    if ((bVar1) ||
       (bVar1 = std::operator==(paths.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,"author"), !bVar1
       )) {
      bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
      if ((bVar1) ||
         (bVar1 = std::operator==(paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"email"),
         !bVar1)) {
        bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
        if ((bVar1) ||
           (bVar1 = std::operator==(paths.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"date"),
           !bVar1)) {
          bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
          if ((bVar1) ||
             (bVar1 = std::operator==(paths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"msg"),
             !bVar1)) {
            bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
            if ((bVar1) ||
               (bVar1 = std::operator==(paths.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"files"),
               !bVar1)) {
              bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
              if ((bVar1) ||
                 (bVar1 = std::operator==(paths.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "file_adds"), !bVar1)) {
                bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
                if ((!bVar1) &&
                   (bVar1 = std::operator==(paths.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            "file_dels"), bVar1)) {
                  local_108._M_current =
                       (char *)std::vector<char,_std::allocator<char>_>::begin(&this->CData);
                  local_110._M_current =
                       (char *)std::vector<char,_std::allocator<char>_>::end(&this->CData);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::
                  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                            (local_100,local_108,local_110,(allocator<char> *)((long)&__range9 + 7))
                  ;
                  std::allocator<char>::~allocator((allocator<char> *)((long)&__range9 + 7));
                  __end9 = std::
                           vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                           ::begin(&this->Changes);
                  change_1 = (Change *)
                             std::
                             vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                             ::end(&this->Changes);
                  while (bVar1 = __gnu_cxx::operator!=
                                           (&__end9,(
                                                  __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                                                  *)&change_1), bVar1) {
                    pCVar3 = __gnu_cxx::
                             __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                             ::operator*(&__end9);
                    lVar4 = std::__cxx11::string::find(local_100,(ulong)&pCVar3->Path);
                    if (lVar4 != -1) {
                      pCVar3->Action = 'D';
                    }
                    __gnu_cxx::
                    __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                    ::operator++(&__end9);
                  }
                  std::__cxx11::string::~string(local_100);
                }
              }
              else {
                local_b0._M_current =
                     (char *)std::vector<char,_std::allocator<char>_>::begin(&this->CData);
                local_b8._M_current =
                     (char *)std::vector<char,_std::allocator<char>_>::end(&this->CData);
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                          (local_a8,local_b0,local_b8,(allocator<char> *)((long)&__range8 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&__range8 + 7));
                __end8 = std::
                         vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::
                         begin(&this->Changes);
                change = (Change *)
                         std::
                         vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::
                         end(&this->Changes);
                while (bVar1 = __gnu_cxx::operator!=
                                         (&__end8,(
                                                  __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                                                  *)&change), bVar1) {
                  added_paths_1.field_2._8_8_ =
                       __gnu_cxx::
                       __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                       ::operator*(&__end8);
                  lVar4 = std::__cxx11::string::find
                                    (local_a8,(ulong)&((reference)added_paths_1.field_2._8_8_)->Path
                                    );
                  if (lVar4 != -1) {
                    *(undefined1 *)added_paths_1.field_2._8_8_ = 0x41;
                  }
                  __gnu_cxx::
                  __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                  ::operator++(&__end8);
                }
                std::__cxx11::string::~string(local_a8);
              }
            }
            else {
              SplitCData_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range7,this);
              __end7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__range7);
              path = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range7);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end7,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&path), bVar1) {
                local_50 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&__end7);
                cmCTestGlobalVC::Change::Change(&local_78,'U');
                cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_78);
                cmCTestGlobalVC::Change::~Change(&local_78);
                std::__cxx11::string::operator=
                          ((string *)&(this->CurChange).Path,(string *)local_50);
                std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::
                push_back(&this->Changes,&this->CurChange);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end7);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range7);
            }
          }
          else {
            pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
            std::vector<char,_std::allocator<char>_>::size(&this->CData);
            std::__cxx11::string::assign((char *)&(this->Rev).Log,(ulong)pvVar2);
          }
        }
        else {
          pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
          std::vector<char,_std::allocator<char>_>::size(&this->CData);
          std::__cxx11::string::assign((char *)&(this->Rev).Date,(ulong)pvVar2);
        }
      }
      else {
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
        std::vector<char,_std::allocator<char>_>::size(&this->CData);
        std::__cxx11::string::assign((char *)&(this->Rev).EMail,(ulong)pvVar2);
      }
    }
    else {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
      std::vector<char,_std::allocator<char>_>::size(&this->CData);
      std::__cxx11::string::assign((char *)&(this->Rev).Author,(ulong)pvVar2);
    }
  }
  std::vector<char,_std::allocator<char>_>::clear(&this->CData);
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "logentry") {
      this->HG->DoRevision(this->Rev, this->Changes);
    } else if (!this->CData.empty() && name == "author") {
      this->Rev.Author.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "email") {
      this->Rev.EMail.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "date") {
      this->Rev.Date.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "msg") {
      this->Rev.Log.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "files") {
      std::vector<std::string> paths = this->SplitCData();
      for (std::string const& path : paths) {
        // Updated by default, will be modified using file_adds and
        // file_dels.
        this->CurChange = Change('U');
        this->CurChange.Path = path;
        this->Changes.push_back(this->CurChange);
      }
    } else if (!this->CData.empty() && name == "file_adds") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (Change& change : this->Changes) {
        if (added_paths.find(change.Path) != std::string::npos) {
          change.Action = 'A';
        }
      }
    } else if (!this->CData.empty() && name == "file_dels") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (Change& change : this->Changes) {
        if (added_paths.find(change.Path) != std::string::npos) {
          change.Action = 'D';
        }
      }
    }
    this->CData.clear();
  }